

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O0

void pele::physics::turbinflow::TurbInflow::fill_turb_plane
               (TurbParm *a_tp,Vector<double,_std::allocator<double>_> *x,
               Vector<double,_std::allocator<double>_> *y,Real z,FArrayBox *v)

{
  iterator pdVar1;
  BaseFab<double> *in_RCX;
  long in_RDI;
  double in_XMM0_Qa;
  Array4<double> *sd;
  GpuArray<double,_3U> *dxinv;
  Real *szlo;
  GpuArray<double,_3U> *pboxlo;
  GpuArray<int,_3U> *npboxcells;
  Real velScale;
  Real *yd;
  Real *xd;
  DeviceVector<amrex::Real> y_dev;
  DeviceVector<amrex::Real> x_dev;
  Array4<double> *vd;
  Box *bx;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb78;
  PODVector<double,_std::allocator<double>_> *in_stack_fffffffffffffb80;
  Box *this;
  Real in_stack_fffffffffffffb88;
  TurbParm *in_stack_fffffffffffffb90;
  anon_class_264_11_9f62ccc4 *f;
  Box *box;
  undefined1 auStack_3f0 [64];
  undefined1 auStack_3b0 [64];
  ulong local_370;
  Array4<double> local_368;
  Array4<double> *local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  ulong local_300;
  double *local_2f8;
  double *local_2f0;
  double *local_2e8;
  double *local_2e0;
  double *local_2d0;
  double *local_2c8;
  PODVector<double,_std::allocator<double>_> local_2b8;
  PODVector<double,_std::allocator<double>_> local_2a0;
  Array4<double> local_288;
  Array4<double> *local_248;
  Box *local_240;
  BaseFab<double> *local_238;
  long local_218;
  undefined4 local_20c;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  long local_1f0;
  BaseFab<double> *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1cc;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Dim3 local_17c;
  Dim3 local_170;
  Dim3 local_160;
  int local_154;
  undefined8 *local_150;
  double *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  undefined4 local_128;
  undefined4 uStack_124;
  int local_120;
  undefined4 local_11c;
  undefined8 *local_118;
  undefined4 local_10c;
  undefined8 *local_108;
  undefined4 local_fc;
  undefined8 *local_f8;
  Dim3 local_f0;
  Box *local_e0;
  int local_d8;
  int iStack_d4;
  int local_d0;
  undefined4 local_cc;
  Box *local_c8;
  undefined4 local_bc;
  Box *local_b8;
  undefined4 local_ac;
  Box *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  int *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_1f8 = in_RDI + 0x48;
  local_1fc = 2;
  local_238 = in_RCX;
  local_218 = in_RDI;
  if (*(double *)(in_RDI + 0x58) * 0.5 + *(double *)(in_RDI + 0xb0) <= in_XMM0_Qa) {
    local_208 = in_RDI + 0x48;
    local_20c = 2;
    if (in_XMM0_Qa <= *(double *)(in_RDI + 0x58) * -0.5 + *(double *)(in_RDI + 0xb8))
    goto LAB_010d731c;
  }
  read_turb_planes(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
LAB_010d731c:
  local_240 = amrex::BaseFab<double>::box(local_238);
  local_1e8 = local_238;
  local_198 = local_238->dptr;
  local_1a0 = &local_238->domain;
  local_1a4 = local_238->nvar;
  local_ac = 0;
  local_d8 = (local_1a0->smallend).vect[0];
  local_bc = 1;
  iStack_d4 = (local_238->domain).smallend.vect[1];
  local_1c0.x = (local_1a0->smallend).vect[0];
  local_1c0.y = (local_1a0->smallend).vect[1];
  local_cc = 2;
  local_1c0.z = (local_238->domain).smallend.vect[2];
  local_8 = &(local_238->domain).bigend;
  local_c = 0;
  local_38 = local_8->vect[0] + 1;
  local_18 = &(local_238->domain).bigend;
  local_1c = 1;
  iStack_34 = (local_238->domain).bigend.vect[1] + 1;
  local_28 = &(local_238->domain).bigend;
  local_2c = 2;
  local_1e0.z = (local_238->domain).bigend.vect[2] + 1;
  local_1e0.y = iStack_34;
  local_1e0.x = local_38;
  local_1cc._0_8_ = local_1e0._0_8_;
  local_1cc.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_f0._0_8_ = local_1c0._0_8_;
  local_f0.z = local_1c0.z;
  local_e0 = local_1a0;
  local_d0 = local_1c0.z;
  local_c8 = local_1a0;
  local_b8 = local_1a0;
  local_a8 = local_1a0;
  local_50._0_8_ = local_1e0._0_8_;
  local_50.z = local_1e0.z;
  local_40 = local_1a0;
  local_30 = local_1e0.z;
  amrex::Array4<double>::Array4(&local_288,local_198,&local_1b0,&local_1cc,local_1a4);
  local_248 = &local_288;
  amrex::Vector<double,_std::allocator<double>_>::size
            ((Vector<double,_std::allocator<double>_> *)0x10d75dc);
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (in_stack_fffffffffffffb80,(size_type)in_stack_fffffffffffffb78);
  amrex::Vector<double,_std::allocator<double>_>::size
            ((Vector<double,_std::allocator<double>_> *)0x10d75f9);
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (in_stack_fffffffffffffb80,(size_type)in_stack_fffffffffffffb78);
  local_2c8 = (double *)
              std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffb78);
  local_2d0 = (double *)std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffb78)
  ;
  pdVar1 = amrex::PODVector<double,_std::allocator<double>_>::begin(&local_2a0);
  amrex::Gpu::
  copyAsync<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double*>
            (local_2c8,local_2d0,pdVar1);
  local_2e0 = (double *)
              std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffb78);
  local_2e8 = (double *)std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffb78)
  ;
  pdVar1 = amrex::PODVector<double,_std::allocator<double>_>::begin(&local_2b8);
  amrex::Gpu::
  copyAsync<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double*>
            (local_2e0,local_2e8,pdVar1);
  local_2f0 = amrex::PODVector<double,_std::allocator<double>_>::data(&local_2a0);
  local_2f8 = amrex::PODVector<double,_std::allocator<double>_>::data(&local_2b8);
  if (*(int *)(local_218 + 0x94) == 1) {
    local_300 = *(ulong *)(local_218 + 0xd0) ^ 0x8000000000000000;
  }
  else {
    local_300 = *(ulong *)(local_218 + 0xd0);
  }
  local_308 = local_218 + 0x20;
  local_310 = local_218 + 0x30;
  local_318 = local_218 + 0xb0;
  local_320 = local_218 + 0x60;
  local_1f0 = *(long *)(local_218 + 0xa8);
  local_148 = *(double **)(local_1f0 + 0x10);
  local_150 = (undefined8 *)(local_1f0 + 0x18);
  local_154 = *(int *)(local_1f0 + 0x34);
  local_fc = 0;
  local_128 = *(undefined4 *)local_150;
  local_10c = 1;
  uStack_124 = *(undefined4 *)(local_1f0 + 0x1c);
  local_170._0_8_ = *local_150;
  local_11c = 2;
  local_170.z = *(int *)(local_1f0 + 0x20);
  local_58 = (int *)(local_1f0 + 0x24);
  local_5c = 0;
  local_88 = *local_58 + 1;
  local_68 = local_1f0 + 0x24;
  local_6c = 1;
  iStack_84 = *(int *)(local_1f0 + 0x28) + 1;
  local_78 = local_1f0 + 0x24;
  local_7c = 2;
  local_190.z = *(int *)(local_1f0 + 0x2c) + 1;
  local_190.y = iStack_84;
  local_190.x = local_88;
  local_17c._0_8_ = local_190._0_8_;
  local_17c.z = local_190.z;
  local_160._0_8_ = local_170._0_8_;
  local_160.z = local_170.z;
  local_140._0_8_ = local_170._0_8_;
  local_140.z = local_170.z;
  local_130 = local_150;
  local_120 = local_170.z;
  local_118 = local_150;
  local_108 = local_150;
  local_f8 = local_150;
  local_a0._0_8_ = local_190._0_8_;
  local_a0.z = local_190.z;
  local_90 = local_150;
  local_80 = local_190.z;
  amrex::Array4<double>::Array4(&local_368,local_148,&local_160,&local_17c,local_154);
  local_328 = &local_368;
  f = *(anon_class_264_11_9f62ccc4 **)((local_240->smallend).vect + 2);
  box = *(Box **)((local_240->bigend).vect + 1);
  this = local_240;
  memcpy(auStack_3f0,local_328,0x3c);
  memcpy(auStack_3b0,local_248,0x3c);
  local_370 = local_300;
  amrex::
  ParallelFor<pele::physics::turbinflow::TurbInflow::fill_turb_plane(pele::physics::turbinflow::TurbParm&,amrex::Vector<double,std::allocator<double>>const&,amrex::Vector<double,std::allocator<double>>const&,double,amrex::FArrayBox&)::__0>
            (box,f);
  amrex::Gpu::synchronize();
  amrex::PODVector<double,_std::allocator<double>_>::~PODVector
            ((PODVector<double,_std::allocator<double>_> *)this);
  amrex::PODVector<double,_std::allocator<double>_>::~PODVector
            ((PODVector<double,_std::allocator<double>_> *)this);
  return;
}

Assistant:

void
TurbInflow::fill_turb_plane(
  TurbParm& a_tp,
  const amrex::Vector<amrex::Real>& x,
  const amrex::Vector<amrex::Real>& y,
  amrex::Real z,
  amrex::FArrayBox& v)
{
  if (
    (z < a_tp.szlo + 0.5 * a_tp.dx[2]) || (z > a_tp.szhi - 0.5 * a_tp.dx[2])) {
#if 0
    {
      amrex::AllPrint() << "Reading new data because z " << z << " is outside " << a_tp.szlo + 0.5 * a_tp.dx[2] << " and "
                     << a_tp.szhi - 0.5 * a_tp.dx[2] << std::endl;
    }
#endif
    read_turb_planes(a_tp, z);
  }

  const auto& bx = v.box();
  const auto& vd = v.array();

  amrex::Gpu::DeviceVector<amrex::Real> x_dev(x.size());
  amrex::Gpu::DeviceVector<amrex::Real> y_dev(y.size());
  amrex::Gpu::copyAsync(
    amrex::Gpu::hostToDevice, x.begin(), x.end(), x_dev.begin());
  amrex::Gpu::copyAsync(
    amrex::Gpu::hostToDevice, y.begin(), y.end(), y_dev.begin());
  amrex::Real* xd = x_dev.data();
  amrex::Real* yd = y_dev.data();

  amrex::Real velScale = (a_tp.side == amrex::Orientation::high)
                           ? -a_tp.turb_scale_vel
                           : a_tp.turb_scale_vel;
  const auto& npboxcells = a_tp.npboxcells;
  const auto& pboxlo = a_tp.pboxlo;
  const auto& szlo = a_tp.szlo;
  const auto& dxinv = a_tp.dxinv;
  const auto& sd = a_tp.sdata->array();

  amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE(int i, int j, int k) noexcept {
    amrex::Real cx[3], cy[3], cz[3], ydata[3];
    amrex::Real zdata[3][3];

    amrex::Real zz =
      (z - szlo) * dxinv[2];        // How many dz away from the left side ?
    int k0 = (int)(std::round(zz)); // What's the closest point ?
    zz -= amrex::Real(k0);
    cz[0] = 0.5 * (zz - 1.0) * (zz - 2.0); // Weight of k0 - 1
    cz[1] = zz * (2.0 - zz);               // Weight of k0
    cz[2] = 0.5 * zz * (zz - 1.0);         // Weight of k0 + 1
    k0 += 1;                               // Index starting at 1

    for (int n = 0; n < AMREX_SPACEDIM; ++n) {
      amrex::Real xx = (xd[i - bx.smallEnd(0)] - pboxlo[0]) * dxinv[0];
      amrex::Real yy = (yd[j - bx.smallEnd(1)] - pboxlo[1]) * dxinv[1];
      int i0 = (int)(std::round(xx));
      int j0 = (int)(std::round(yy));
      xx -= amrex::Real(i0);
      yy -= amrex::Real(j0);
      cx[0] = 0.5 * (xx - 1.0) * (xx - 2.0);
      cy[0] = 0.5 * (yy - 1.0) * (yy - 2.0);
      cx[1] = xx * (2.0 - xx);
      cy[1] = yy * (2.0 - yy);
      cx[2] = 0.5 * xx * (xx - 1.0);
      cy[2] = 0.5 * yy * (yy - 1.0);

      if (i0 >= 0 && i0 < npboxcells[0] && j0 >= 0 && j0 < npboxcells[1]) {
        i0 += 2;
        j0 += 2;
        for (int ii = 0; ii <= 2; ++ii) {
          for (int jj = 0; jj <= 2; ++jj) {
            zdata[ii][jj] = cz[0] * sd(i0 + ii, j0 + jj, k0 - 1, n) +
                            cz[1] * sd(i0 + ii, j0 + jj, k0, n) +
                            cz[2] * sd(i0 + ii, j0 + jj, k0 + 1, n);
          }
        }
        for (int ii = 0; ii <= 2; ++ii) {
          ydata[ii] =
            cy[0] * zdata[ii][0] + cy[1] * zdata[ii][1] + cy[2] * zdata[ii][2];
        }
        vd(i, j, k, n) = cx[0] * ydata[0] + cx[1] * ydata[1] + cx[2] * ydata[2];
        vd(i, j, k, n) *= velScale;
      }
    }
  });
  amrex::Gpu::synchronize(); // Ensure that DeviceVector's don't leave scope
                             // early
}